

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall
QGraphicsView::ensureVisible(QGraphicsView *this,QRectF *rect,int xmargin,int ymargin)

{
  int iVar1;
  int iVar2;
  QGraphicsViewPrivate *this_00;
  QWidget *pQVar3;
  qint64 qVar4;
  qint64 qVar5;
  QScrollBar *pQVar6;
  long in_FS_OFFSET;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pQVar3 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  dVar9 = (double)(((pQVar3->data->crect).x2.m_i - (pQVar3->data->crect).x1.m_i) + 1);
  pQVar3 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
  iVar1 = (pQVar3->data->crect).y2.m_i;
  iVar2 = (pQVar3->data->crect).y1.m_i;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  QTransform::mapRect((QRectF *)&local_58);
  qVar4 = QGraphicsViewPrivate::horizontalScroll(this_00);
  qVar5 = QGraphicsViewPrivate::verticalScroll(this_00);
  dVar8 = (double)xmargin;
  if ((((double)CONCAT44(uStack_54,local_58) <= (double)qVar4 + dVar8) &&
      (this_00->leftIndent == 0.0)) && (!NAN(this_00->leftIndent))) {
    pQVar6 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar6->super_QAbstractSlider,
               (int)(((double)CONCAT44(uStack_54,local_58) - dVar8) + -0.5));
  }
  dVar7 = (double)((iVar1 - iVar2) + 1);
  if ((((dVar9 + (double)qVar4) - dVar8 <=
        (double)CONCAT44(uStack_54,local_58) + (double)CONCAT44(uStack_44,local_48)) &&
      (this_00->leftIndent == 0.0)) && (!NAN(this_00->leftIndent))) {
    pQVar6 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar6->super_QAbstractSlider,
               (int)((((double)CONCAT44(uStack_54,local_58) + (double)CONCAT44(uStack_44,local_48))
                     - dVar9) + dVar8 + 0.5));
  }
  dVar9 = (double)ymargin;
  if ((((double)CONCAT44(uStack_4c,uStack_50) <= (double)qVar5 + dVar9) &&
      (this_00->topIndent == 0.0)) && (!NAN(this_00->topIndent))) {
    pQVar6 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar6->super_QAbstractSlider,
               (int)(((double)CONCAT44(uStack_4c,uStack_50) - dVar9) + -0.5));
  }
  if ((((dVar7 + (double)qVar5) - dVar9 <=
        (double)CONCAT44(uStack_4c,uStack_50) + (double)CONCAT44(uStack_3c,uStack_40)) &&
      (this_00->topIndent == 0.0)) && (!NAN(this_00->topIndent))) {
    pQVar6 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    QAbstractSlider::setValue
              (&pQVar6->super_QAbstractSlider,
               (int)((((double)CONCAT44(uStack_4c,uStack_50) + (double)CONCAT44(uStack_3c,uStack_40)
                      ) - dVar7) + dVar9 + 0.5));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::ensureVisible(const QRectF &rect, int xmargin, int ymargin)
{
    Q_D(QGraphicsView);
    qreal width = viewport()->width();
    qreal height = viewport()->height();
    QRectF viewRect = d->matrix.mapRect(rect);

    qreal left = d->horizontalScroll();
    qreal right = left + width;
    qreal top = d->verticalScroll();
    qreal bottom = top + height;

    if (viewRect.left() <= left + xmargin) {
        // need to scroll from the left
        if (!d->leftIndent)
            horizontalScrollBar()->setValue(int(viewRect.left() - xmargin - 0.5));
    }
    if (viewRect.right() >= right - xmargin) {
        // need to scroll from the right
        if (!d->leftIndent)
            horizontalScrollBar()->setValue(int(viewRect.right() - width + xmargin + 0.5));
    }
    if (viewRect.top() <= top + ymargin) {
        // need to scroll from the top
        if (!d->topIndent)
            verticalScrollBar()->setValue(int(viewRect.top() - ymargin - 0.5));
    }
    if (viewRect.bottom() >= bottom - ymargin) {
        // need to scroll from the bottom
        if (!d->topIndent)
            verticalScrollBar()->setValue(int(viewRect.bottom() - height + ymargin + 0.5));
    }
}